

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_response.hpp
# Opt level: O2

void __thiscall cinatra::coro_http_response::~coro_http_response(coro_http_response *this)

{
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::cookie>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::cookie>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->cookies_)._M_h);
  std::__cxx11::string::~string((string *)&this->boundary_);
  std::vector<cinatra::resp_header,_std::allocator<cinatra::resp_header>_>::~vector
            (&this->resp_headers_);
  std::__cxx11::string::~string((string *)&this->content_);
  return;
}

Assistant:

coro_http_response(coro_http_connection *conn)
      : status_(status_type::not_implemented),
        fmt_type_(format_type::normal),
        delay_(false),
        conn_(conn) {}